

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * kj::_::
       fill<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                 (char *target,Repeat<char> *first,ArrayPtr<const_char> *rest,
                 FixedArray<char,_1UL> *rest_1,CappedArray<char,_14UL> *rest_2,
                 ArrayPtr<const_char> *rest_3,ArrayPtr<const_char> *rest_4)

{
  size_t sVar1;
  char *__dest;
  
  sVar1 = first->count;
  if (sVar1 != 0) {
    memset(target,*(int *)first,sVar1);
    target = target + sVar1;
  }
  sVar1 = rest->size_;
  if (sVar1 != 0) {
    memcpy(target,rest->ptr,sVar1);
    target = target + sVar1;
  }
  *target = rest_1->content[0];
  __dest = target + 1;
  sVar1 = rest_2->currentSize;
  if (sVar1 != 0) {
    memcpy(__dest,rest_2->content,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = rest_3->size_;
  if (sVar1 != 0) {
    memcpy(__dest,rest_3->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = rest_4->size_;
  if (sVar1 != 0) {
    memcpy(__dest,rest_4->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  return __dest;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}